

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void multithreadthroughputtest(void)

{
  long *plVar1;
  ostream *poVar2;
  long lVar3;
  ulong uVar4;
  shared_ptr<SL::WS_LITE::ITLS_Configuration> sVar5;
  allocator<char> local_1da;
  allocator<char> local_1d9;
  long *local_1d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d0;
  shared_ptr<SL::WS_LITE::ITLS_Configuration> clientctx;
  shared_ptr<SL::WS_LITE::IWSHub> c;
  _Any_data local_1a8;
  code *local_198;
  code *pcStack_190;
  _Any_data local_188;
  code *local_178;
  code *pcStack_170;
  atomic<unsigned_long_long> mbsreceived;
  time_point lastheard;
  undefined1 local_158 [16];
  code *local_148;
  code *local_140;
  vector<std::shared_ptr<SL::WS_LITE::IWSHub>,_std::allocator<std::shared_ptr<SL::WS_LITE::IWSHub>_>_>
  clients;
  long *local_110;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_108;
  long *local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8;
  long *local_f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  long *local_e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  time_point sendtimer;
  atomic<unsigned_long_long> mbssent;
  time_point recvtimer;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_b8;
  long *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78 [3];
  long *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58 [3];
  shared_ptr<SL::WS_LITE::IWSHub> listenerctx;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Starting Multi threaded throughput test");
  std::endl<char,std::char_traits<char>>(poVar2);
  clients.
  super__Vector_base<std::shared_ptr<SL::WS_LITE::IWSHub>,_std::allocator<std::shared_ptr<SL::WS_LITE::IWSHub>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  clients.
  super__Vector_base<std::shared_ptr<SL::WS_LITE::IWSHub>,_std::allocator<std::shared_ptr<SL::WS_LITE::IWSHub>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  clients.
  super__Vector_base<std::shared_ptr<SL::WS_LITE::IWSHub>,_std::allocator<std::shared_ptr<SL::WS_LITE::IWSHub>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::shared_ptr<SL::WS_LITE::IWSHub>,_std::allocator<std::shared_ptr<SL::WS_LITE::IWSHub>_>_>
  ::reserve(&clients,0x32);
  recvtimer.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  lastheard.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  LOCK();
  mbsreceived.super___atomic_base<unsigned_long_long>._M_i = (__atomic_base<unsigned_long_long>)0;
  UNLOCK();
  sVar5 = SL::WS_LITE::CreateContext((WS_LITE *)&local_1d8,(ThreadCount)0x2);
  (**(code **)(*local_1d8 + 0x18))
            (&c,local_1d8,
             sVar5.super___shared_ptr<SL::WS_LITE::ITLS_Configuration,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._M_pi);
  (*(c.super___shared_ptr<SL::WS_LITE::IWSHub,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_IWSHub[2])
            (&clientctx,c.super___shared_ptr<SL::WS_LITE::IWSHub,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             ,0xbbc,0,0);
  local_b8._M_bucket_count = 0;
  local_b8._M_element_count =
       (size_type)
       std::
       _Function_handler<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_const_SL::WS_LITE::HttpHeader_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/Test/main.cpp:338:28)>
       ::_M_invoke;
  local_b8._M_before_begin._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_const_SL::WS_LITE::HttpHeader_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/Test/main.cpp:338:28)>
       ::_M_manager;
  local_b8._M_buckets = (__buckets_ptr)&lastheard;
  (*(clientctx.super___shared_ptr<SL::WS_LITE::ITLS_Configuration,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr)->_vptr_ITLS_Configuration[2])(&local_80);
  local_188._8_8_ = 0;
  pcStack_170 = std::
                _Function_handler<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/Test/main.cpp:341:31)>
                ::_M_invoke;
  local_178 = std::
              _Function_handler<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/Test/main.cpp:341:31)>
              ::_M_manager;
  local_188._M_unused._M_object = &lastheard;
  (**(code **)(*local_80 + 0x20))(&local_60);
  local_198 = (code *)0x0;
  pcStack_190 = (code *)0x0;
  local_1a8._M_unused._M_object = (void *)0x0;
  local_1a8._8_8_ = 0;
  local_1a8._M_unused._M_object = operator_new(0x20);
  (((time_point *)local_1a8._M_unused._0_8_)->__d).__r = (rep)&lastheard;
  (((time_point *)((long)local_1a8._M_unused._0_8_ + 8))->__d).__r = (rep)&mbsreceived;
  (((time_point *)((long)local_1a8._M_unused._0_8_ + 0x10))->__d).__r = (rep)&clients;
  (((time_point *)((long)local_1a8._M_unused._0_8_ + 0x18))->__d).__r = (rep)&recvtimer;
  pcStack_190 = std::
                _Function_handler<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_const_SL::WS_LITE::WSMessage_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/Test/main.cpp:344:25)>
                ::_M_invoke;
  local_198 = std::
              _Function_handler<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_const_SL::WS_LITE::WSMessage_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/Test/main.cpp:344:25)>
              ::_M_manager;
  (**(code **)(*local_60 + 0x18))(local_158,local_60);
  (**(code **)(*(long *)local_158._0_8_ + 0x38))(&listenerctx,local_158._0_8_,1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_158 + 8));
  std::_Function_base::~_Function_base((_Function_base *)&local_1a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_188);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&clientctx.
              super___shared_ptr<SL::WS_LITE::ITLS_Configuration,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c.super___shared_ptr<SL::WS_LITE::IWSHub,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1d0);
  LOCK();
  mbssent.super___atomic_base<unsigned_long_long>._M_i = (__atomic_base<unsigned_long_long>)0;
  UNLOCK();
  SL::WS_LITE::CreateContext((WS_LITE *)&clientctx,(ThreadCount)0x2);
  sendtimer.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  for (uVar4 = 0;
      uVar4 < (ulong)((long)clients.
                            super__Vector_base<std::shared_ptr<SL::WS_LITE::IWSHub>,_std::allocator<std::shared_ptr<SL::WS_LITE::IWSHub>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)clients.
                            super__Vector_base<std::shared_ptr<SL::WS_LITE::IWSHub>,_std::allocator<std::shared_ptr<SL::WS_LITE::IWSHub>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4); uVar4 = uVar4 + 1) {
    (*(clientctx.super___shared_ptr<SL::WS_LITE::ITLS_Configuration,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr)->_vptr_ITLS_Configuration[3])(&local_110);
    (**(code **)(*local_110 + 0x18))(&local_100,local_110,0);
    plVar1 = local_100;
    local_178 = (code *)0x0;
    pcStack_170 = (code *)0x0;
    local_188._M_unused._M_object = (void *)0x0;
    local_188._8_8_ = 0;
    local_188._M_unused._M_object = operator_new(0x20);
    (((time_point *)local_188._M_unused._0_8_)->__d).__r = (rep)&clients;
    (((time_point *)((long)local_188._M_unused._0_8_ + 8))->__d).__r = (rep)&lastheard;
    (((time_point *)((long)local_188._M_unused._0_8_ + 0x10))->__d).__r = (rep)&mbssent;
    (((time_point *)((long)local_188._M_unused._0_8_ + 0x18))->__d).__r = (rep)&sendtimer;
    pcStack_170 = std::
                  _Function_handler<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_const_SL::WS_LITE::HttpHeader_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/Test/main.cpp:364:32)>
                  ::_M_invoke;
    local_178 = std::
                _Function_handler<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_const_SL::WS_LITE::HttpHeader_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/Test/main.cpp:364:32)>
                ::_M_manager;
    (**(code **)(*plVar1 + 0x10))(&local_f0,plVar1,&local_188);
    local_1a8._8_8_ = 0;
    pcStack_190 = std::
                  _Function_handler<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/Test/main.cpp:383:35)>
                  ::_M_invoke;
    local_198 = std::
                _Function_handler<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/Test/main.cpp:383:35)>
                ::_M_manager;
    local_1a8._M_unused._0_8_ = &lastheard;
    (**(code **)(*local_f0 + 0x20))(&local_e0,local_f0,&local_1a8);
    local_158._8_8_ = 0;
    local_140 = std::
                _Function_handler<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_const_SL::WS_LITE::WSMessage_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/Test/main.cpp:386:29)>
                ::_M_invoke;
    local_148 = std::
                _Function_handler<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_const_SL::WS_LITE::WSMessage_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/Test/main.cpp:386:29)>
                ::_M_manager;
    local_158._0_8_ = &lastheard;
    (**(code **)(*local_e0 + 0x18))(&local_1d8,local_e0,local_158);
    plVar1 = local_1d8;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"localhost",&local_1d9);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"/",&local_1da);
    local_b8._M_buckets = &local_b8._M_single_bucket;
    local_b8._M_bucket_count = 1;
    local_b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_b8._M_element_count = 0;
    local_b8._M_rehash_policy._M_max_load_factor = 1.0;
    local_b8._M_rehash_policy._4_4_ = 0;
    local_b8._M_rehash_policy._M_next_resize = 0;
    local_b8._M_single_bucket = (__node_base_ptr)0x0;
    (**(code **)(*plVar1 + 0x38))
              (&c,plVar1,(string *)&local_60,0xbbc,1,(string *)&local_80,&local_b8);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_b8);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1d0);
    std::_Function_base::~_Function_base((_Function_base *)local_158);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8);
    std::_Function_base::~_Function_base((_Function_base *)&local_1a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8);
    std::_Function_base::~_Function_base((_Function_base *)&local_188);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108);
    std::
    vector<std::shared_ptr<SL::WS_LITE::IWSHub>,_std::allocator<std::shared_ptr<SL::WS_LITE::IWSHub>_>_>
    ::push_back(&clients,&c);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&c.super___shared_ptr<SL::WS_LITE::IWSHub,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  while( true ) {
    lVar3 = std::chrono::_V2::system_clock::now();
    if (4999999999 < lVar3 - (long)lastheard.__d.__r) break;
    local_b8._M_buckets = (__node_base_ptr *)0xc8;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)&local_b8);
  }
  local_b8._M_buckets = (__buckets_ptr)0xc8;
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
            ((duration<long,_std::ratio<1L,_1000L>_> *)&local_b8);
  poVar2 = std::operator<<((ostream *)&std::cout,"Received ");
  poVar2 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar2);
  poVar2 = std::operator<<(poVar2,"  bytes");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&clientctx.
              super___shared_ptr<SL::WS_LITE::ITLS_Configuration,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&listenerctx.super___shared_ptr<SL::WS_LITE::IWSHub,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  vector<std::shared_ptr<SL::WS_LITE::IWSHub>,_std::allocator<std::shared_ptr<SL::WS_LITE::IWSHub>_>_>
  ::~vector(&clients);
  return;
}

Assistant:

void multithreadthroughputtest()
{
    std::cout << "Starting Multi threaded throughput test" << std::endl;
    std::vector<std::shared_ptr<SL::WS_LITE::IWSHub>> clients;
    clients.reserve(50); // this should use about 1 GB of memory between sending and receiving
    auto recvtimer = std::chrono::high_resolution_clock::now();
    auto lastheard = std::chrono::high_resolution_clock::now();
    std::atomic<unsigned long long> mbsreceived;
    mbsreceived = 0;

    SL::WS_LITE::PortNumber port(3004);
    auto listenerctx =
        SL::WS_LITE::CreateContext(SL::WS_LITE::ThreadCount(2))
            ->NoTLS()
            ->CreateListener(port)
            ->onConnection([&](const std::shared_ptr<SL::WS_LITE::IWebSocket> &socket, const SL::WS_LITE::HttpHeader &header) {
                lastheard = std::chrono::high_resolution_clock::now();
            })
            ->onDisconnection([&](const std::shared_ptr<SL::WS_LITE::IWebSocket> &socket, unsigned short code, const std::string &msg) {
                lastheard = std::chrono::high_resolution_clock::now();
            })
            ->onMessage([&](const std::shared_ptr<SL::WS_LITE::IWebSocket> &socket, const SL::WS_LITE::WSMessage &message) {
                lastheard = std::chrono::high_resolution_clock::now();
                mbsreceived += message.len;
                if (mbsreceived == bufferesize * clients.capacity()) {
                    std::cout << "Took "
                              << std::chrono::duration_cast<std::chrono::milliseconds>(std::chrono::high_resolution_clock::now() - recvtimer).count()
                              << "ms to receive " << bufferesize * clients.capacity() << " bytes" << std::endl;
                }
            })
            ->listen();

    std::atomic<unsigned long long> mbssent;
    mbssent = 0;

    auto clientctx = SL::WS_LITE::CreateContext(SL::WS_LITE::ThreadCount(2));
    auto sendtimer = std::chrono::high_resolution_clock::now();
    for (size_t i = 0; i < clients.capacity(); i++) {
        auto c =
            clientctx->NoTLS()
                ->CreateClient()
                ->onConnection([&clients, &lastheard, &mbssent, &sendtimer](const std::shared_ptr<SL::WS_LITE::IWebSocket> &socket,
                                                                            const SL::WS_LITE::HttpHeader &header) {
                    lastheard = std::chrono::high_resolution_clock::now();
                    SL::WS_LITE::WSMessage msg;
                    msg.Buffer = std::shared_ptr<unsigned char>(new unsigned char[bufferesize], [&](unsigned char *p) {
                        mbssent += bufferesize;
                        if (mbssent == bufferesize * clients.capacity()) {
                            std::cout << "Took "
                                      << std::chrono::duration_cast<std::chrono::milliseconds>(std::chrono::high_resolution_clock::now() - sendtimer)
                                             .count()
                                      << "ms to send " << bufferesize * clients.capacity() << " bytes" << std::endl;
                        }
                        delete[] p;
                    });
                    msg.len = bufferesize; // 10MB
                    msg.code = SL::WS_LITE::OpCode::BINARY;
                    msg.data = msg.Buffer.get();
                    socket->send(msg, SL::WS_LITE::CompressionOptions::NO_COMPRESSION);
                })
                ->onDisconnection([&](const std::shared_ptr<SL::WS_LITE::IWebSocket> &socket, unsigned short code, const std::string &msg) {
                    lastheard = std::chrono::high_resolution_clock::now();
                })
                ->onMessage([&](const std::shared_ptr<SL::WS_LITE::IWebSocket> &socket, const SL::WS_LITE::WSMessage &message) {
                    lastheard = std::chrono::high_resolution_clock::now();
                })
                ->connect("localhost", port);
        clients.push_back(c);
    }
    while (std::chrono::duration_cast<std::chrono::milliseconds>(std::chrono::high_resolution_clock::now() - lastheard).count() < 5000) {
        std::this_thread::sleep_for(200ms);
    }
    std::this_thread::sleep_for(200ms);
    std::cout << "Received " << mbsreceived << "  bytes" << std::endl;
}